

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O1

optional<pbrt::SampledLight> * __thiscall
pbrt::BVHLightSampler::Sample
          (optional<pbrt::SampledLight> *__return_storage_ptr__,BVHLightSampler *this,
          LightSampleContext *ctx,Float u)

{
  LightBVHNode *pLVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_t sVar4;
  anon_struct_8_0_00000001_for___align aVar5;
  LightBVHNode *pLVar6;
  float fVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  ushort uVar15;
  long lVar16;
  ulong uVar17;
  Bounds3f *allb;
  long in_FS_OFFSET;
  Float FVar18;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar19 [16];
  undefined4 extraout_XMM0_Dd;
  aligned_storage_t<sizeof(pbrt::SampledLight),_alignof(pbrt::SampledLight)> aVar20;
  aligned_storage_t<sizeof(pbrt::SampledLight),_alignof(pbrt::SampledLight)> aVar21;
  aligned_storage_t<sizeof(pbrt::SampledLight),_alignof(pbrt::SampledLight)> aVar22;
  undefined1 auVar23 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 in_ZMM1 [64];
  float fVar26;
  undefined1 auVar27 [16];
  Point3f p;
  Point3f p_00;
  Point3f p_01;
  Normal3f n;
  Normal3f n_00;
  Normal3f n_01;
  Float ci [2];
  LightBVHNode node;
  float local_d8;
  float local_d4;
  Float local_c8 [4];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [16];
  Bounds3f *local_88;
  CompactLightBounds local_80;
  undefined8 uStack_68;
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [60];
  
  sVar3 = (this->infiniteLights).nStored;
  sVar4 = (this->nodes).nStored;
  auVar9 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,sVar3);
  auVar10 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,(sVar3 + 1) - (ulong)(sVar4 == 0));
  fVar26 = auVar9._0_4_;
  fVar24 = fVar26 / auVar10._0_4_;
  if (fVar24 <= u) {
    if (sVar4 == 0) {
      aVar22._0_12_ = ZEXT812(0);
      aVar22._12_4_ = 0;
      __return_storage_ptr__->optionalValue = aVar22;
      *(undefined8 *)&__return_storage_ptr__->set = 0;
    }
    else {
      auVar9._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar9._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar9._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar9._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      uVar2 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
      auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                             ,0x10);
      auVar27._0_4_ = (float)uVar2 + auVar9._0_4_;
      auVar27._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar9._4_4_;
      auVar27._8_4_ = auVar9._8_4_ + 0.0;
      auVar27._12_4_ = auVar9._12_4_ + 0.0;
      auVar10._8_4_ = 0x3f000000;
      auVar10._0_8_ = 0x3f0000003f000000;
      auVar10._12_4_ = 0x3f000000;
      local_a0 = vmulps_avx512vl(auVar27,auVar10);
      fVar7 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               low + (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      local_b0._0_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      local_b0._4_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      uStack_a8 = 0;
      fVar26 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      local_d4 = 1.0 - fVar24;
      auVar19._0_4_ = (u - fVar24) / local_d4;
      auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar19);
      auVar23 = ZEXT1664(auVar9);
      allb = &this->allLightBounds;
      uVar17 = 0;
      local_88 = allb;
      do {
        auVar9 = local_a0;
        local_d8 = auVar23._0_4_;
        pLVar6 = (this->nodes).ptr;
        pLVar1 = pLVar6 + uVar17;
        local_80.w = (pLVar1->lightBounds).w;
        local_80.phi = (pLVar1->lightBounds).phi;
        local_80.field_2 = (pLVar1->lightBounds).field_2;
        local_80.qb[0][0] = *(uint16_t *)((long)((pLVar1->lightBounds).qb + 0) + 0);
        local_80.qb[0][1] = *(uint16_t *)((long)((pLVar1->lightBounds).qb + 0) + 2);
        local_80.qb._4_8_ = *(undefined8 *)((pLVar1->lightBounds).qb[0] + 2);
        uStack_68 = *(undefined8 *)&pLVar1->field_1;
        lVar16 = (long)(int)(uint)uStack_68;
        if (lVar16 < 0) {
          if ((0 < (int)uVar17) ||
             (p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar7,
             p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)local_a0._0_4_,
             p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)local_a0._4_4_,
             n_01.super_Tuple3<pbrt::Normal3,_float>.z = fVar26,
             n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_b0,
             n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_b0._4_4_, local_a0 = auVar9,
             FVar18 = CompactLightBounds::Importance(&local_80,p_01,n_01,allb), 0.0 < FVar18)) {
            aVar5 = (anon_struct_8_0_00000001_for___align)
                    (this->lights).ptr[(uint)uStack_68 & 0x7fffffff].
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    .bits;
            __return_storage_ptr__->set = true;
            (__return_storage_ptr__->optionalValue).__align = aVar5;
            *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = local_d4;
          }
          else {
            aVar21._0_12_ = ZEXT812(0);
            aVar21._12_4_ = 0;
            __return_storage_ptr__->optionalValue = aVar21;
            *(undefined8 *)&__return_storage_ptr__->set = 0;
            uVar17 = 0;
          }
          uVar15 = 0;
LAB_0025dc65:
          auVar23 = ZEXT464((uint)local_d8);
        }
        else {
          p.super_Tuple3<pbrt::Point3,_float>.z = fVar7;
          p.super_Tuple3<pbrt::Point3,_float>.x = (float)local_a0._0_4_;
          p.super_Tuple3<pbrt::Point3,_float>.y = (float)local_a0._4_4_;
          n.super_Tuple3<pbrt::Normal3,_float>.z = fVar26;
          n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_b0;
          n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_b0._4_4_;
          local_a0 = auVar9;
          local_c8[0] = CompactLightBounds::Importance(&pLVar6[uVar17 + 1].lightBounds,p,n,allb);
          auVar9 = local_a0;
          p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar7;
          p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)local_a0._0_4_;
          p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)local_a0._4_4_;
          n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar26;
          n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_b0;
          n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_b0._4_4_;
          local_c8[2] = local_c8[0];
          local_c8[3] = (Float)extraout_XMM0_Db;
          uStack_b8 = extraout_XMM0_Dc;
          uStack_b4 = extraout_XMM0_Dd;
          local_a0 = auVar9;
          auVar23._0_4_ = CompactLightBounds::Importance(&pLVar6[lVar16].lightBounds,p_00,n_00,allb)
          ;
          auVar23._4_60_ = extraout_var;
          local_c8[1] = auVar23._0_4_;
          auVar12._4_4_ = local_c8[3];
          auVar12._0_4_ = local_c8[2];
          auVar12._8_4_ = uStack_b8;
          auVar12._12_4_ = uStack_b4;
          uVar2 = vcmpps_avx512vl(ZEXT816(0) << 0x40,auVar12,4);
          uVar8 = vcmpps_avx512vl(auVar23._0_16_,ZEXT816(0) << 0x40,4);
          uVar15 = (ushort)uVar8 | (ushort)uVar2;
          if ((uVar15 & 1) == 0) {
            aVar20._0_12_ = ZEXT412(0);
            aVar20._12_4_ = 0;
            __return_storage_ptr__->optionalValue = aVar20;
            *(undefined8 *)&__return_storage_ptr__->set = 0;
            goto LAB_0025dc65;
          }
          local_c8[2] = 0.0;
          lVar16 = 0;
          do {
            local_c8[2] = local_c8[2] + *(float *)((long)local_c8 + lVar16);
            lVar16 = lVar16 + 4;
          } while (lVar16 != 8);
          lVar16 = 0;
          do {
            if (local_d8 < local_c8[lVar16] / local_c8[2]) goto LAB_0025dc76;
            local_d8 = local_d8 - local_c8[lVar16] / local_c8[2];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 2);
          lVar16 = 2;
LAB_0025dc76:
          if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
             (iVar13 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)
                                            ::reg), iVar13 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
                       SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
                       {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
            __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
          }
          *(long *)(in_FS_OFFSET + -0x610) = *(long *)(in_FS_OFFSET + -0x610) + 1;
          if (lVar16 == 2) {
            *(long *)(in_FS_OFFSET + -0x618) = *(long *)(in_FS_OFFSET + -0x618) + 1;
            lVar16 = 1;
          }
          auVar25._0_4_ = local_d8 / (local_c8[(int)lVar16] / local_c8[2]);
          auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar25);
          local_d4 = local_d4 * (local_c8[(int)lVar16] / local_c8[2]);
          auVar23 = ZEXT1664(auVar9);
          uVar11 = (int)uVar17 + 1;
          if ((int)lVar16 != 0) {
            uVar11 = (uint)uStack_68 & 0x7fffffff;
          }
          uVar17 = (ulong)uVar11;
          allb = local_88;
        }
      } while ((uVar15 & 1) != 0);
    }
  }
  else {
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar24 * u)));
    iVar14 = (int)(auVar9._0_4_ * fVar26);
    iVar13 = (int)sVar3 + -1;
    if (iVar14 <= iVar13) {
      iVar13 = iVar14;
    }
    aVar5 = (anon_struct_8_0_00000001_for___align)
            (this->infiniteLights).ptr[iVar13].
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align = aVar5;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = fVar24 / fVar26;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<SampledLight> Sample(const LightSampleContext &ctx, Float u) const {
        // Compute infinite light sampling probability _pInfinite_
        Float pInfinite = Float(infiniteLights.size()) /
                          Float(infiniteLights.size() + (!nodes.empty() ? 1 : 0));

        if (u < pInfinite) {
            // Sample infinite lights with uniform probability
            u = std::min<Float>(u * pInfinite, OneMinusEpsilon);
            int index =
                std::min<int>(u * infiniteLights.size(), infiniteLights.size() - 1);
            Float pdf = pInfinite * 1.f / infiniteLights.size();
            return SampledLight{infiniteLights[index], pdf};

        } else {
            // Traverse light BVH to sample light
            if (nodes.empty())
                return {};
            // Declare common variables for light BVH traversal
            Point3f p = ctx.p();
            Normal3f n = ctx.ns;
            u = std::min<Float>((u - pInfinite) / (1 - pInfinite), OneMinusEpsilon);
            int nodeIndex = 0;
            Float pdf = (1 - pInfinite);

            while (true) {
                // Process light BVH node for light sampling
                LightBVHNode node = nodes[nodeIndex];
                if (!node.isLeaf) {
                    // Compute light BVH child node importances
                    const LightBVHNode *children[2] = {&nodes[nodeIndex + 1],
                                                       &nodes[node.childOrLightIndex]};
                    Float ci[2] = {
                        children[0]->lightBounds.Importance(p, n, allLightBounds),
                        children[1]->lightBounds.Importance(p, n, allLightBounds)};
                    if (ci[0] == 0 && ci[1] == 0)
                        return {};

                    // Randomly sample light BVH child node
                    Float nodePDF;
                    int child = SampleDiscrete(ci, u, &nodePDF, &u);
                    pdf *= nodePDF;
                    nodeIndex = (child == 0) ? (nodeIndex + 1) : node.childOrLightIndex;

                } else {
                    // Confirm light has non-zero importance before returning light sample
                    if (nodeIndex > 0)
                        DCHECK_GT(node.lightBounds.Importance(p, n, allLightBounds), 0);
                    if (nodeIndex > 0 ||
                        node.lightBounds.Importance(p, n, allLightBounds) > 0)
                        return SampledLight{lights[node.childOrLightIndex], pdf};
                    return {};
                }
            }
        }
    }